

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,double timeout)

{
  string *psVar1;
  int i;
  int iVar2;
  cmsysProcess *cp;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  pointer pbVar6;
  bool bVar7;
  int length;
  char *data;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<char,_std::allocator<char>_> tempStdOut;
  vector<char,_std::allocator<char>_> tempStdErr;
  int local_ac;
  string *local_a8;
  char *local_a0;
  char **local_98;
  iterator iStack_90;
  char **local_88;
  char *local_78;
  char *pcStack_70;
  long local_68;
  char *local_60;
  void *local_58;
  void *pvStack_50;
  long local_48;
  int *local_40;
  double local_38;
  
  local_98 = (char **)0x0;
  iStack_90._M_current = (char **)0x0;
  local_88 = (char **)0x0;
  pbVar6 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = captureStdErr;
  local_60 = dir;
  local_40 = retVal;
  local_38 = timeout;
  if (pbVar6 != (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_78 = (pbVar6->_M_dataplus)._M_p;
      if (iStack_90._M_current == local_88) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_98,iStack_90,&local_78)
        ;
      }
      else {
        *iStack_90._M_current = local_78;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != (command->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_78 = (char *)0x0;
  if (iStack_90._M_current == local_88) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_98,iStack_90,&local_78);
  }
  else {
    *iStack_90._M_current = (char *)0x0;
    iStack_90._M_current = iStack_90._M_current + 1;
  }
  psVar1 = local_a8;
  if (captureStdOut != (string *)0x0) {
    std::__cxx11::string::_M_replace
              ((ulong)captureStdOut,0,(char *)captureStdOut->_M_string_length,0x4fcadd);
  }
  if (psVar1 != captureStdOut && psVar1 != (string *)0x0) {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)psVar1->_M_string_length,0x4fcadd);
  }
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp,local_98);
  cmsysProcess_SetWorkingDirectory(cp,local_60);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp,2,1);
    cmsysProcess_SetPipeShared(cp,3,1);
  }
  cmsysProcess_SetTimeout(cp,local_38);
  cmsysProcess_Execute(cp);
  local_60 = (char *)CONCAT71(local_60._1_7_,psVar1 == captureStdOut || psVar1 == (string *)0x0);
  local_78 = (char *)0x0;
  pcStack_70 = (char *)0x0;
  local_68 = 0;
  local_48 = 0;
  local_58 = (void *)0x0;
  pvStack_50 = (void *)0x0;
  if (outputflag != OUTPUT_PASSTHROUGH) {
    bVar7 = local_a8 != (string *)0x0;
    if (outputflag != OUTPUT_NONE || (captureStdOut != (string *)0x0 || bVar7)) {
LAB_00233ece:
      do {
        iVar2 = cmsysProcess_WaitForData(cp,&local_a0,&local_ac,(double *)0x0);
        if (iVar2 < 1) break;
        if (0 < local_ac && (outputflag != OUTPUT_NONE || (captureStdOut != (string *)0x0 || bVar7))
           ) {
          lVar3 = 0;
          do {
            if (local_a0[lVar3] == '\0') {
              local_a0[lVar3] = ' ';
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < local_ac);
        }
        if ((iVar2 == 2) || (iVar2 == 3 && local_a8 == captureStdOut)) {
          if (captureStdOut != (string *)0x0) {
            std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                      ((vector<char,std::allocator<char>> *)&local_78,pcStack_70);
          }
        }
        else if (local_a8 != (string *)0x0 && iVar2 == 3) {
          std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                    ((vector<char,std::allocator<char>> *)&local_58,pvStack_50);
        }
        if (outputflag != OUTPUT_NONE) {
          if (outputflag != OUTPUT_MERGE) {
            if (iVar2 == 3) {
              Stderr(local_a0,(long)local_ac);
              goto LAB_00233ece;
            }
            if (iVar2 != 2) goto LAB_00233ece;
          }
          Stdout(local_a0,(long)local_ac);
        }
      } while( true );
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  psVar1 = local_a8;
  if ((captureStdOut != (string *)0x0) && (local_78 != pcStack_70)) {
    std::__cxx11::string::append((char *)captureStdOut,(ulong)local_78);
  }
  if (((char)local_60 == '\0') && (local_58 != pvStack_50)) {
    std::__cxx11::string::append((char *)psVar1,(ulong)local_58);
  }
  iVar2 = cmsysProcess_GetState(cp);
  if (iVar2 == 4) {
    if (local_40 == (int *)0x0) {
      iVar2 = cmsysProcess_GetExitValue(cp);
      bVar7 = iVar2 == 0;
    }
    else {
      iVar2 = cmsysProcess_GetExitValue(cp);
      *local_40 = iVar2;
      bVar7 = true;
    }
  }
  else {
    iVar2 = cmsysProcess_GetState(cp);
    if (iVar2 == 2) {
      pcVar4 = cmsysProcess_GetExceptionString(cp);
      if (outputflag != OUTPUT_NONE) {
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x5c1ca8);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
      if (psVar1 != (string *)0x0) {
        strlen(pcVar4);
        std::__cxx11::string::append((char *)psVar1,(ulong)pcVar4);
      }
    }
    else {
      iVar2 = cmsysProcess_GetState(cp);
      if (iVar2 == 1) {
        pcVar4 = cmsysProcess_GetErrorString(cp);
        if (outputflag != OUTPUT_NONE) {
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x5c1ca8);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
          std::ostream::put(-0x58);
          std::ostream::flush();
        }
        if (psVar1 != (string *)0x0) {
          strlen(pcVar4);
          std::__cxx11::string::append((char *)psVar1,(ulong)pcVar4);
        }
      }
      else {
        iVar2 = cmsysProcess_GetState(cp);
        bVar7 = true;
        if (iVar2 != 5) goto LAB_0023423c;
        if (outputflag != OUTPUT_NONE) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Process terminated due to timeout\n",0x22);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
          std::ostream::put(-0x58);
          std::ostream::flush();
        }
        if (psVar1 != (string *)0x0) {
          std::__cxx11::string::append((char *)psVar1,0x4b04fb);
        }
      }
    }
    bVar7 = false;
  }
LAB_0023423c:
  cmsysProcess_Delete(cp);
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  if (local_78 != (char *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  if (local_98 != (char **)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return bVar7;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string>const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr,
                                     int* retVal , const char* dir ,
                                     OutputOption outputflag ,
                                     double timeout )
{
  std::vector<const char*> argv;
  for(std::vector<std::string>::const_iterator a = command.begin();
      a != command.end(); ++a)
    {
    argv.push_back(a->c_str());
    }
  argv.push_back(0);
  if ( captureStdOut )
    {
    *captureStdOut = "";
    }
  if (captureStdErr && captureStdErr != captureStdOut)
    {
    *captureStdErr = "";
    }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if(cmSystemTools::GetRunCommandHideConsole())
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
    }

  if (outputflag == OUTPUT_PASSTHROUGH)
    {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    }

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  if(outputflag != OUTPUT_PASSTHROUGH &&
     (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE))
    {
    while((pipe = cmsysProcess_WaitForData(cp, &data, &length, 0)) > 0)
      {
      if(captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)
        {
        // Translate NULL characters in the output into valid text.
        // Visual Studio 7 puts these characters in the output of its
        // build process.
        for(int i=0; i < length; ++i)
          {
          if(data[i] == '\0')
            {
            data[i] = ' ';
            }
          }
        }
      if(pipe == cmsysProcess_Pipe_STDOUT ||
         (pipe == cmsysProcess_Pipe_STDERR &&
          captureStdOut == captureStdErr))
        {
        if (captureStdOut)
          {
          tempStdOut.insert(tempStdOut.end(), data, data+length);
          }
        }
      else if(pipe == cmsysProcess_Pipe_STDERR)
        {
        if (captureStdErr)
          {
          tempStdErr.insert(tempStdErr.end(), data, data+length);
          }
        }
      if(outputflag != OUTPUT_NONE)
        {
        if(outputflag == OUTPUT_MERGE)
          {
          cmSystemTools::Stdout(data, length);
          }
        else
          {
          if(pipe == cmsysProcess_Pipe_STDERR)
            {
            cmSystemTools::Stderr(data, length);
            }
          else if(pipe == cmsysProcess_Pipe_STDOUT)
            {
            cmSystemTools::Stdout(data, length);
            }
          }
        }
      }
    }

  cmsysProcess_WaitForExit(cp, 0);
  if ( captureStdOut && tempStdOut.begin() != tempStdOut.end())
    {
    captureStdOut->append(&*tempStdOut.begin(), tempStdOut.size());
    }
  if ( captureStdErr && captureStdErr != captureStdOut &&
       tempStdErr.begin() != tempStdErr.end())
    {
    captureStdErr->append(&*tempStdErr.begin(), tempStdErr.size());
    }

  bool result = true;
  if(cmsysProcess_GetState(cp) == cmsysProcess_State_Exited)
    {
    if ( retVal )
      {
      *retVal = cmsysProcess_GetExitValue(cp);
      }
    else
      {
      if ( cmsysProcess_GetExitValue(cp) !=  0 )
        {
        result = false;
        }
      }
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Exception)
    {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << exception_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(exception_str, strlen(exception_str));
      }
    result = false;
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Error)
    {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << error_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(error_str, strlen(error_str));
      }
    result = false;
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Expired)
    {
    const char* error_str = "Process terminated due to timeout\n";
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << error_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(error_str, strlen(error_str));
      }
    result = false;
    }

  cmsysProcess_Delete(cp);
  return result;
}